

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void free_D_Grammar(Grammar *g)

{
  Production *__ptr;
  Rule *r_00;
  Elem *__ptr_00;
  Term *__ptr_01;
  State *__ptr_02;
  State *s;
  Term *t;
  Elem *e;
  Rule *r;
  Production *p;
  uint local_18;
  uint k;
  uint j;
  uint i;
  Grammar *g_local;
  
  for (k = 0; k < (g->productions).n; k = k + 1) {
    __ptr = (g->productions).v[k];
    for (local_18 = 0; local_18 < (__ptr->rules).n; local_18 = local_18 + 1) {
      r_00 = (__ptr->rules).v[local_18];
      if (r_00 == g->r) {
        g->r = (Rule *)0x0;
      }
      for (p._4_4_ = 0; p._4_4_ < (r_00->elems).n; p._4_4_ = p._4_4_ + 1) {
        __ptr_00 = (r_00->elems).v[p._4_4_];
        if (__ptr_00 == __ptr->elem) {
          __ptr->elem = (Elem *)0x0;
        }
        free(__ptr_00);
      }
      if (r_00->end == __ptr->elem) {
        __ptr->elem = (Elem *)0x0;
      }
      free_rule(r_00);
    }
    if (((__ptr->rules).v != (Rule **)0x0) && ((__ptr->rules).v != (__ptr->rules).e)) {
      free((__ptr->rules).v);
    }
    (__ptr->rules).n = 0;
    (__ptr->rules).v = (Rule **)0x0;
    free(__ptr->name);
    if (__ptr->elem != (Elem *)0x0) {
      free_rule(__ptr->elem->rule);
      free(__ptr->elem);
    }
    free(__ptr);
  }
  if (((g->productions).v != (Production **)0x0) && ((g->productions).v != (g->productions).e)) {
    free((g->productions).v);
  }
  (g->productions).n = 0;
  (g->productions).v = (Production **)0x0;
  for (k = 0; k < (g->terminals).n; k = k + 1) {
    __ptr_01 = (g->terminals).v[k];
    if (__ptr_01->string != (char *)0x0) {
      free(__ptr_01->string);
    }
    if (__ptr_01->term_name != (char *)0x0) {
      free(__ptr_01->term_name);
    }
    free(__ptr_01);
  }
  if (((g->terminals).v != (Term **)0x0) && ((g->terminals).v != (g->terminals).e)) {
    free((g->terminals).v);
  }
  (g->terminals).n = 0;
  (g->terminals).v = (Term **)0x0;
  for (k = 0; k < (g->actions).n; k = k + 1) {
    free_Action((g->actions).v[k]);
  }
  if (((g->actions).v != (Action **)0x0) && ((g->actions).v != (g->actions).e)) {
    free((g->actions).v);
  }
  (g->actions).n = 0;
  (g->actions).v = (Action **)0x0;
  if ((g->scanner).code != (char *)0x0) {
    free((g->scanner).code);
  }
  for (k = 0; k < (g->states).n; k = k + 1) {
    __ptr_02 = (g->states).v[k];
    if (((__ptr_02->items).v != (Item **)0x0) && ((__ptr_02->items).v != (__ptr_02->items).e)) {
      free((__ptr_02->items).v);
    }
    (__ptr_02->items).n = 0;
    (__ptr_02->items).v = (Item **)0x0;
    if (((__ptr_02->items_hash).v != (Item **)0x0) &&
       ((__ptr_02->items_hash).v != (__ptr_02->items_hash).e)) {
      free((__ptr_02->items_hash).v);
    }
    (__ptr_02->items_hash).n = 0;
    (__ptr_02->items_hash).v = (Item **)0x0;
    for (local_18 = 0; local_18 < (__ptr_02->gotos).n; local_18 = local_18 + 1) {
      free((__ptr_02->gotos).v[local_18]->elem);
      free((__ptr_02->gotos).v[local_18]);
    }
    if (((__ptr_02->gotos).v != (Goto **)0x0) && ((__ptr_02->gotos).v != (__ptr_02->gotos).e)) {
      free((__ptr_02->gotos).v);
    }
    (__ptr_02->gotos).n = 0;
    (__ptr_02->gotos).v = (Goto **)0x0;
    if (((__ptr_02->shift_actions).v != (Action **)0x0) &&
       ((__ptr_02->shift_actions).v != (__ptr_02->shift_actions).e)) {
      free((__ptr_02->shift_actions).v);
    }
    (__ptr_02->shift_actions).n = 0;
    (__ptr_02->shift_actions).v = (Action **)0x0;
    if (((__ptr_02->reduce_actions).v != (Action **)0x0) &&
       ((__ptr_02->reduce_actions).v != (__ptr_02->reduce_actions).e)) {
      free((__ptr_02->reduce_actions).v);
    }
    (__ptr_02->reduce_actions).n = 0;
    (__ptr_02->reduce_actions).v = (Action **)0x0;
    for (local_18 = 0; local_18 < (__ptr_02->right_epsilon_hints).n; local_18 = local_18 + 1) {
      free((__ptr_02->right_epsilon_hints).v[local_18]);
    }
    if (((__ptr_02->right_epsilon_hints).v != (Hint **)0x0) &&
       ((__ptr_02->right_epsilon_hints).v != (__ptr_02->right_epsilon_hints).e)) {
      free((__ptr_02->right_epsilon_hints).v);
    }
    (__ptr_02->right_epsilon_hints).n = 0;
    (__ptr_02->right_epsilon_hints).v = (Hint **)0x0;
    for (local_18 = 0; local_18 < (__ptr_02->error_recovery_hints).n; local_18 = local_18 + 1) {
      free((__ptr_02->error_recovery_hints).v[local_18]);
    }
    if (((__ptr_02->error_recovery_hints).v != (Hint **)0x0) &&
       ((__ptr_02->error_recovery_hints).v != (__ptr_02->error_recovery_hints).e)) {
      free((__ptr_02->error_recovery_hints).v);
    }
    (__ptr_02->error_recovery_hints).n = 0;
    (__ptr_02->error_recovery_hints).v = (Hint **)0x0;
    if (__ptr_02->same_shifts == (State *)0x0) {
      for (local_18 = 0; local_18 < (__ptr_02->scanner).states.n; local_18 = local_18 + 1) {
        if ((((__ptr_02->scanner).states.v[local_18]->accepts).v != (Action **)0x0) &&
           (((__ptr_02->scanner).states.v[local_18]->accepts).v !=
            ((__ptr_02->scanner).states.v[local_18]->accepts).e)) {
          free(((__ptr_02->scanner).states.v[local_18]->accepts).v);
        }
        ((__ptr_02->scanner).states.v[local_18]->accepts).n = 0;
        ((__ptr_02->scanner).states.v[local_18]->accepts).v = (Action **)0x0;
        if ((((__ptr_02->scanner).states.v[local_18]->live).v != (Action **)0x0) &&
           (((__ptr_02->scanner).states.v[local_18]->live).v !=
            ((__ptr_02->scanner).states.v[local_18]->live).e)) {
          free(((__ptr_02->scanner).states.v[local_18]->live).v);
        }
        ((__ptr_02->scanner).states.v[local_18]->live).n = 0;
        ((__ptr_02->scanner).states.v[local_18]->live).v = (Action **)0x0;
        free((__ptr_02->scanner).states.v[local_18]);
      }
      if (((__ptr_02->scanner).states.v != (ScanState **)0x0) &&
         ((__ptr_02->scanner).states.v != (__ptr_02->scanner).states.e)) {
        free((__ptr_02->scanner).states.v);
      }
      (__ptr_02->scanner).states.n = 0;
      (__ptr_02->scanner).states.v = (ScanState **)0x0;
      for (local_18 = 0; local_18 < (__ptr_02->scanner).transitions.n; local_18 = local_18 + 1) {
        if ((__ptr_02->scanner).transitions.v[local_18] != (ScanStateTransition *)0x0) {
          if ((((__ptr_02->scanner).transitions.v[local_18]->live_diff).v != (Action **)0x0) &&
             (((__ptr_02->scanner).transitions.v[local_18]->live_diff).v !=
              ((__ptr_02->scanner).transitions.v[local_18]->live_diff).e)) {
            free(((__ptr_02->scanner).transitions.v[local_18]->live_diff).v);
          }
          ((__ptr_02->scanner).transitions.v[local_18]->live_diff).n = 0;
          ((__ptr_02->scanner).transitions.v[local_18]->live_diff).v = (Action **)0x0;
          if ((((__ptr_02->scanner).transitions.v[local_18]->accepts_diff).v != (Action **)0x0) &&
             (((__ptr_02->scanner).transitions.v[local_18]->accepts_diff).v !=
              ((__ptr_02->scanner).transitions.v[local_18]->accepts_diff).e)) {
            free(((__ptr_02->scanner).transitions.v[local_18]->accepts_diff).v);
          }
          ((__ptr_02->scanner).transitions.v[local_18]->accepts_diff).n = 0;
          ((__ptr_02->scanner).transitions.v[local_18]->accepts_diff).v = (Action **)0x0;
          free((__ptr_02->scanner).transitions.v[local_18]);
        }
      }
      if (((__ptr_02->scanner).transitions.v != (ScanStateTransition **)0x0) &&
         ((__ptr_02->scanner).transitions.v != (__ptr_02->scanner).transitions.e)) {
        free((__ptr_02->scanner).transitions.v);
      }
      (__ptr_02->scanner).transitions.n = 0;
      (__ptr_02->scanner).transitions.v = (ScanStateTransition **)0x0;
    }
    free(__ptr_02->goto_valid);
    free(__ptr_02);
  }
  if (((g->states).v != (State **)0x0) && ((g->states).v != (g->states).e)) {
    free((g->states).v);
  }
  (g->states).n = 0;
  (g->states).v = (State **)0x0;
  for (k = 0; k < g->ncode; k = k + 1) {
    free(g->code[k].code);
  }
  free(g->code);
  for (k = 0; k < (g->declarations).n; k = k + 1) {
    free((g->declarations).v[k]->elem);
    free((g->declarations).v[k]);
  }
  if (((g->declarations).v != (Declaration **)0x0) && ((g->declarations).v != (g->declarations).e))
  {
    free((g->declarations).v);
  }
  (g->declarations).n = 0;
  (g->declarations).v = (Declaration **)0x0;
  for (k = 0; k < (g->passes).n; k = k + 1) {
    free((g->passes).v[k]->name);
    free((g->passes).v[k]);
  }
  if (((g->passes).v != (D_Pass **)0x0) && ((g->passes).v != (g->passes).e)) {
    free((g->passes).v);
  }
  (g->passes).n = 0;
  (g->passes).v = (D_Pass **)0x0;
  for (k = 0; k < (g->all_pathnames).n; k = k + 1) {
    free((g->all_pathnames).v[k]);
  }
  free(g->pathname);
  if (g->default_white_space != (char *)0x0) {
    free(g->default_white_space);
  }
  free(g);
  return;
}

Assistant:

void free_D_Grammar(Grammar *g) {
  uint i, j, k;

  for (i = 0; i < g->productions.n; i++) {
    Production *p = g->productions.v[i];
    for (j = 0; j < p->rules.n; j++) {
      Rule *r = p->rules.v[j];
      if (r == g->r) g->r = 0;
      for (k = 0; k < r->elems.n; k++) {
        Elem *e = r->elems.v[k];
        if (e == p->elem) p->elem = 0;
        FREE(e);
      }
      if (r->end == p->elem) p->elem = 0;
      free_rule(r);
    }
    vec_free(&p->rules);
    FREE(p->name);
    if (p->elem) {
      free_rule(p->elem->rule);
      FREE(p->elem);
    }
    FREE(p);
  }
  vec_free(&g->productions);
  for (i = 0; i < g->terminals.n; i++) {
    Term *t = g->terminals.v[i];
    if (t->string) FREE(t->string);
    if (t->term_name) FREE(t->term_name);
    FREE(t);
  }
  vec_free(&g->terminals);
  for (i = 0; i < g->actions.n; i++) free_Action(g->actions.v[i]);
  vec_free(&g->actions);
  if (g->scanner.code) FREE(g->scanner.code);
  for (i = 0; i < g->states.n; i++) {
    State *s = g->states.v[i];
    vec_free(&s->items);
    vec_free(&s->items_hash);
    for (j = 0; j < s->gotos.n; j++) {
      FREE(s->gotos.v[j]->elem);
      FREE(s->gotos.v[j]);
    }
    vec_free(&s->gotos);
    vec_free(&s->shift_actions);
    vec_free(&s->reduce_actions);
    for (j = 0; j < s->right_epsilon_hints.n; j++) FREE(s->right_epsilon_hints.v[j]);
    vec_free(&s->right_epsilon_hints);
    for (j = 0; j < s->error_recovery_hints.n; j++) FREE(s->error_recovery_hints.v[j]);
    vec_free(&s->error_recovery_hints);
    if (!s->same_shifts) {
      for (j = 0; j < s->scanner.states.n; j++) {
        vec_free(&s->scanner.states.v[j]->accepts);
        vec_free(&s->scanner.states.v[j]->live);
        FREE(s->scanner.states.v[j]);
      }
      vec_free(&s->scanner.states);
      for (j = 0; j < s->scanner.transitions.n; j++)
        if (s->scanner.transitions.v[j]) {
          vec_free(&s->scanner.transitions.v[j]->live_diff);
          vec_free(&s->scanner.transitions.v[j]->accepts_diff);
          FREE(s->scanner.transitions.v[j]);
        }
      vec_free(&s->scanner.transitions);
    }
    FREE(s->goto_valid);
    FREE(s);
  }
  vec_free(&g->states);
  for (i = 0; i < g->ncode; i++) FREE(g->code[i].code);
  FREE(g->code);
  for (i = 0; i < g->declarations.n; i++) {
    FREE(g->declarations.v[i]->elem);
    FREE(g->declarations.v[i]);
  }
  vec_free(&g->declarations);
  for (i = 0; i < g->passes.n; i++) {
    FREE(g->passes.v[i]->name);
    FREE(g->passes.v[i]);
  }
  vec_free(&g->passes);
  for (i = 0; i < g->all_pathnames.n; i++) FREE(g->all_pathnames.v[i]);
  FREE(g->pathname);
  if (g->default_white_space) FREE(g->default_white_space);
  FREE(g);
}